

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constant_medium.h
# Opt level: O2

bool __thiscall constant_medium::hit(constant_medium *this,ray *r,interval ray_t,hit_record *rec)

{
  double dVar1;
  double dVar2;
  element_type *peVar3;
  int iVar4;
  bool bVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  double dVar8;
  double dVar9;
  hit_record rec2;
  hit_record rec1;
  point3 local_f0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_a0;
  double local_98;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_40;
  double local_38;
  
  local_48 = 0;
  _Stack_40._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_58 = 0;
  uStack_50 = 0;
  local_68 = 0;
  uStack_60 = 0;
  local_78 = 0;
  uStack_70 = 0;
  local_a8 = 0;
  _Stack_a0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_b8 = 0;
  uStack_b0 = 0;
  local_c8 = 0;
  uStack_c0 = 0;
  local_d8 = 0;
  uStack_d0 = 0;
  iVar4 = (*((this->boundary).super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            _vptr_hittable[2])(SUB84(interval::universe.min,0),interval::universe.max);
  if ((char)iVar4 != '\0') {
    peVar3 = (this->boundary).super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    iVar4 = (*peVar3->_vptr_hittable[2])
                      (SUB84(local_38 + 0.0001,0),0x7ff0000000000000,peVar3,r,&local_d8);
    if ((char)iVar4 != '\0') {
      uVar6 = SUB84(local_38,0);
      uVar7 = (undefined4)((ulong)local_38 >> 0x20);
      if (local_38 < ray_t.min) {
        uVar6 = ray_t.min._0_4_;
        uVar7 = ray_t.min._4_4_;
        local_38 = ray_t.min;
      }
      if (ray_t.max < local_98) {
        local_98 = ray_t.max;
      }
      if ((double)CONCAT44(uVar7,uVar6) < local_98) {
        if ((double)CONCAT44(uVar7,uVar6) <= 0.0 && (double)CONCAT44(uVar7,uVar6) != 0.0) {
          local_38 = 0.0;
          uVar6 = 0;
          uVar7 = 0;
        }
        dVar1 = (r->dir).e[0];
        dVar2 = (r->dir).e[1];
        dVar8 = (r->dir).e[2];
        dVar8 = SQRT(dVar8 * dVar8 + dVar1 * dVar1 + dVar2 * dVar2);
        dVar9 = local_98 - (double)CONCAT44(uVar7,uVar6);
        dVar1 = this->neg_inv_density;
        dVar2 = random_double();
        dVar2 = log(dVar2);
        dVar2 = dVar2 * dVar1;
        if (dVar2 <= dVar9 * dVar8) {
          dVar1 = dVar2 / dVar8 + local_38;
          rec->t = dVar1;
          ray::at(&local_f0,r,dVar1);
          (rec->p).e[2] = local_f0.e[2];
          (rec->p).e[0] = local_f0.e[0];
          (rec->p).e[1] = local_f0.e[1];
          (rec->normal).e[0] = 1.0;
          (rec->normal).e[1] = 0.0;
          (rec->normal).e[2] = 0.0;
          rec->front_face = true;
          std::__shared_ptr<material,_(__gnu_cxx::_Lock_policy)2>::operator=
                    (&(rec->mat).super___shared_ptr<material,_(__gnu_cxx::_Lock_policy)2>,
                     &(this->phase_function).
                      super___shared_ptr<material,_(__gnu_cxx::_Lock_policy)2>);
          bVar5 = true;
          goto LAB_00118de5;
        }
      }
    }
  }
  bVar5 = false;
LAB_00118de5:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_a0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_40);
  return bVar5;
}

Assistant:

bool hit(const ray& r, interval ray_t, hit_record& rec) const override {
        hit_record rec1, rec2;

        if (!boundary->hit(r, interval::universe, rec1))
            return false;

        if (!boundary->hit(r, interval(rec1.t+0.0001, infinity), rec2))
            return false;

        if (rec1.t < ray_t.min) rec1.t = ray_t.min;
        if (rec2.t > ray_t.max) rec2.t = ray_t.max;

        if (rec1.t >= rec2.t)
            return false;

        if (rec1.t < 0)
            rec1.t = 0;

        auto ray_length = r.direction().length();
        auto distance_inside_boundary = (rec2.t - rec1.t) * ray_length;
        auto hit_distance = neg_inv_density * std::log(random_double());

        if (hit_distance > distance_inside_boundary)
            return false;

        rec.t = rec1.t + hit_distance / ray_length;
        rec.p = r.at(rec.t);

        rec.normal = vec3(1,0,0);  // arbitrary
        rec.front_face = true;     // also arbitrary
        rec.mat = phase_function;

        return true;
    }